

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall imrt::EvaluationFunction::Zrollback(EvaluationFunction *this)

{
  pointer pvVar1;
  long lVar2;
  _List_node_base *p_Var3;
  long lVar4;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *this_00;
  
  pvVar1 = (this->Z).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->Z_diff;
  p_Var3 = (_List_node_base *)this_00;
  while (p_Var3 = (((_List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)this_00) {
    lVar4 = (long)*(int *)((long)&p_Var3[1]._M_next + 4);
    lVar2 = *(long *)&pvVar1[*(int *)&p_Var3[1]._M_next].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    *(double *)(lVar2 + lVar4 * 8) = *(double *)(lVar2 + lVar4 * 8) - (double)p_Var3[1]._M_prev;
  }
  std::__cxx11::
  _List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
            );
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this_00->
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

void EvaluationFunction::Zrollback(){
	for(auto z:Z_diff){
		int o=z.first.first;
		int k=z.first.second;
		Z[o][k]-=z.second;
	}
	Z_diff.clear();
}